

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O3

void WebRtcIsac_EncodeRc(int16_t *RCQ15,Bitstr *streamdata)

{
  ushort uVar1;
  short sVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int index [6];
  uint local_28 [8];
  
  lVar3 = 0;
  do {
    uVar1 = WebRtcIsac_kQArRcInitIndex[lVar3];
    uVar5 = (ulong)uVar1;
    uVar4 = (uint)uVar1;
    local_28[lVar3] = (uint)uVar1;
    sVar2 = RCQ15[lVar3];
    if (WebRtcIsac_kQArBoundaryLevels[uVar5] < sVar2) {
      if ((uVar1 < 0xb) &&
         (uVar5 = (ulong)(uVar1 + 1 & 0xffff), WebRtcIsac_kQArBoundaryLevels[uVar5] < sVar2)) {
        do {
          uVar6 = uVar5;
          if (uVar6 == 0xb) {
            uVar4 = 0xb;
            goto LAB_001565e8;
          }
          uVar5 = uVar6 + 1;
        } while (WebRtcIsac_kQArBoundaryLevels[uVar6 + 1] < sVar2);
        uVar4 = (int)(uVar6 + 1) - 1;
LAB_001565e8:
        local_28[lVar3] = (uint)uVar6;
      }
    }
    else {
      uVar6 = uVar5;
      if (uVar5 != 0) {
        do {
          uVar6 = uVar6 - 1;
          uVar5 = uVar5 - 1;
          uVar4 = (uint)uVar5;
          if (WebRtcIsac_kQArBoundaryLevels[uVar6 & 0xffffffff] <= sVar2) break;
        } while (0 < (int)uVar6);
        local_28[lVar3] = uVar4;
      }
    }
    RCQ15[lVar3] = WebRtcIsac_kQArRcLevelsPtr[lVar3][(int)uVar4];
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) {
      WebRtcIsac_EncHistMulti(streamdata,(int *)local_28,WebRtcIsac_kQArRcCdfPtr,6);
      return;
    }
  } while( true );
}

Assistant:

void WebRtcIsac_EncodeRc(int16_t* RCQ15, Bitstr* streamdata) {
  int k;
  int index[AR_ORDER];

  /* quantize reflection coefficients (add noise feedback?) */
  for (k = 0; k < AR_ORDER; k++) {
    index[k] = WebRtcIsac_kQArRcInitIndex[k];
    // The safe-guards in following while conditions are to suppress gcc 4.8.3
    // warnings, Issue 2888. Otherwise, first and last elements of
    // |WebRtcIsac_kQArBoundaryLevels| are such that the following search
    // *never* cause an out-of-boundary read.
    if (RCQ15[k] > WebRtcIsac_kQArBoundaryLevels[index[k]]) {
      while (index[k] + 1 < NUM_AR_RC_QUANT_BAUNDARY &&
        RCQ15[k] > WebRtcIsac_kQArBoundaryLevels[index[k] + 1]) {
        index[k]++;
      }
    } else {
      while (index[k] > 0 &&
        RCQ15[k] < WebRtcIsac_kQArBoundaryLevels[--index[k]]) ;
    }
    RCQ15[k] = *(WebRtcIsac_kQArRcLevelsPtr[k] + index[k]);
  }

  /* entropy coding of quantization indices */
  WebRtcIsac_EncHistMulti(streamdata, index, WebRtcIsac_kQArRcCdfPtr, AR_ORDER);
}